

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::cut(QLineEdit *this)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  
  bVar1 = hasSelectedText(this);
  if (bVar1) {
    copy(this,in_RSI,src);
    del(this);
    return;
  }
  return;
}

Assistant:

void QLineEdit::cut()
{
    if (hasSelectedText()) {
        copy();
        del();
    }
}